

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O0

ostream * test_detail::
          print_range<std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>,burst::identity_fn>
                    (ostream *stream,
                    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *range)

{
  anon_class_16_2_aa65ec36 __f;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *stream_00;
  bool bVar1;
  reference value;
  vector<char,_std::allocator<char>_> *vector;
  const_iterator cVar2;
  __normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
  __first;
  ostream *poVar3;
  __normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
  local_28;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *range_local;
  ostream *stream_local;
  
  local_20 = range;
  range_local = (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *)stream;
  std::operator<<(stream,"[");
  local_28._M_current =
       (vector<char,_std::allocator<char>_> *)
       std::
       begin<std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>>
                 (local_20);
  local_30._M_current =
       (vector<char,_std::allocator<char>_> *)
       std::
       end<std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>>
                 (local_20);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  stream_00 = range_local;
  if (bVar1) {
    local_38._M_current =
         (vector<char,_std::allocator<char>_> *)
         std::
         begin<std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>>
                   (local_20);
    value = __gnu_cxx::
            __normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
            ::operator*(&local_38);
    vector = burst::identity_fn::operator()((identity_fn *)((long)&stream_local + 7),value);
    std::operator<<((ostream *)stream_00,vector);
    cVar2 = std::
            begin<std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>>
                      (local_20);
    __first = std::
              next<__gnu_cxx::__normal_iterator<std::vector<char,std::allocator<char>>const*,std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>>>
                        ((__normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
                          )cVar2._M_current,1);
    cVar2 = std::
            end<std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>>
                      (local_20);
    __f.proj = (identity_fn *)((long)&stream_local + 7);
    __f.stream = (ostream *)range_local;
    std::
    for_each<__gnu_cxx::__normal_iterator<std::vector<char,std::allocator<char>>const*,std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>>,test_detail::print_range<std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>,burst::identity_fn>(std::ostream&,std::vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              (__first,(__normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
                        )cVar2._M_current,__f);
  }
  poVar3 = std::operator<<((ostream *)range_local,"]");
  return poVar3;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }